

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall Catch::JunitReporter::writeAssertion(JunitReporter *this,AssertionStats *stats)

{
  OfType OVar1;
  pointer pcVar2;
  pointer pMVar3;
  uint uVar4;
  ostream *poVar5;
  char *pcVar6;
  XmlWriter *pXVar7;
  pointer pMVar8;
  undefined1 local_200 [8];
  ostringstream oss;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1f0 [6];
  ios_base local_190 [264];
  XmlWriter *local_88;
  undefined1 local_80 [8];
  string elementName;
  ScopedElement e;
  size_type local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  size_t local_38;
  
  OVar1 = (stats->assertionResult).m_resultData.resultType;
  if ((OVar1 & FailureBit) == Ok) {
    return;
  }
  if (((stats->assertionResult).m_info.resultDisposition & SuppressFail) != 0) {
    return;
  }
  local_80 = (undefined1  [8])&elementName._M_string_length;
  elementName._M_dataplus._M_p = (pointer)0x0;
  elementName._M_string_length._0_1_ = 0;
  pcVar6 = "failure";
  if (OVar1 < Exception) {
    uVar4 = OVar1 + Info;
    if (0x13 < uVar4) goto LAB_0016181e;
    if ((0x2000fU >> (uVar4 & 0x1f) & 1) == 0) {
      if ((0xc0000U >> (uVar4 & 0x1f) & 1) == 0) goto LAB_0016181e;
    }
    else {
LAB_001617c4:
      pcVar6 = "internalError";
    }
  }
  else {
    if (OVar1 < DidntThrowException) {
      if (OVar1 == Exception) goto LAB_001617c4;
      if (OVar1 != ThrewException) goto LAB_0016181e;
    }
    else {
      if (OVar1 == DidntThrowException) goto LAB_00161811;
      if (OVar1 != FatalErrorCondition) goto LAB_0016181e;
    }
    pcVar6 = "error";
  }
LAB_00161811:
  std::__cxx11::string::_M_replace((ulong)local_80,0,(char *)0x0,(ulong)pcVar6);
LAB_0016181e:
  pXVar7 = &this->xml;
  elementName.field_2._8_8_ = pXVar7;
  XmlWriter::startElement(pXVar7,(string *)local_80);
  local_200 = (undefined1  [8])local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"message","");
  pcVar2 = (stats->assertionResult).m_resultData.reconstructedExpression._M_dataplus._M_p;
  e.m_writer = (XmlWriter *)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&e,pcVar2,
             pcVar2 + (stats->assertionResult).m_resultData.reconstructedExpression._M_string_length
            );
  XmlWriter::writeAttribute(pXVar7,(string *)local_200,(string *)&e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e.m_writer != &local_48) {
    operator_delete(e.m_writer,local_48._M_allocated_capacity + 1);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
  }
  local_200 = (undefined1  [8])local_1f0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_200,"type","");
  pcVar2 = (stats->assertionResult).m_info.macroName._M_dataplus._M_p;
  e.m_writer = (XmlWriter *)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&e,pcVar2,pcVar2 + (stats->assertionResult).m_info.macroName._M_string_length
            );
  XmlWriter::writeAttribute(pXVar7,(string *)local_200,(string *)&e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e.m_writer != &local_48) {
    operator_delete(e.m_writer,local_48._M_allocated_capacity + 1);
  }
  if (local_200 != (undefined1  [8])local_1f0) {
    operator_delete((void *)local_200,local_1f0[0]._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_200);
  pcVar2 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
  e.m_writer = (XmlWriter *)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&e,pcVar2,
             pcVar2 + (stats->assertionResult).m_resultData.message._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e.m_writer != &local_48) {
    operator_delete(e.m_writer,local_48._M_allocated_capacity + 1);
  }
  local_88 = pXVar7;
  if (local_50 != 0) {
    pcVar2 = (stats->assertionResult).m_resultData.message._M_dataplus._M_p;
    e.m_writer = (XmlWriter *)&local_48;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&e,pcVar2,
               pcVar2 + (stats->assertionResult).m_resultData.message._M_string_length);
    poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_200,&(e.m_writer)->m_tagIsOpen,local_50);
    std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)e.m_writer != &local_48) {
      operator_delete(e.m_writer,local_48._M_allocated_capacity + 1);
    }
  }
  pMVar8 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_start;
  pMVar3 = (stats->infoMessages).
           super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pMVar8 != pMVar3) {
    do {
      if (pMVar8->type == Info) {
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_200,(pMVar8->message)._M_dataplus._M_p,
                            (pMVar8->message)._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
      }
      pMVar8 = pMVar8 + 1;
    } while (pMVar8 != pMVar3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_200,"at ",3);
  pcVar2 = (stats->assertionResult).m_info.lineInfo.file._M_dataplus._M_p;
  e.m_writer = (XmlWriter *)&local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&e,pcVar2,
             pcVar2 + (stats->assertionResult).m_info.lineInfo.file._M_string_length);
  pXVar7 = local_88;
  local_38 = (stats->assertionResult).m_info.lineInfo.line;
  operator<<((ostream *)local_200,(SourceLineInfo *)&e);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e.m_writer != &local_48) {
    operator_delete(e.m_writer,local_48._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  XmlWriter::writeText(pXVar7,(string *)&e,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)e.m_writer != &local_48) {
    operator_delete(e.m_writer,local_48._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_200);
  std::ios_base::~ios_base(local_190);
  XmlWriter::ScopedElement::~ScopedElement((ScopedElement *)((long)&elementName.field_2 + 8));
  if (local_80 != (undefined1  [8])&elementName._M_string_length) {
    operator_delete((void *)local_80,
                    CONCAT71(elementName._M_string_length._1_7_,
                             (undefined1)elementName._M_string_length) + 1);
  }
  return;
}

Assistant:

void writeAssertion( AssertionStats const& stats ) {
            AssertionResult const& result = stats.assertionResult;
            if( !result.isOk() ) {
                std::string elementName;
                switch( result.getResultType() ) {
                    case ResultWas::ThrewException:
                    case ResultWas::FatalErrorCondition:
                        elementName = "error";
                        break;
                    case ResultWas::ExplicitFailure:
                        elementName = "failure";
                        break;
                    case ResultWas::ExpressionFailed:
                        elementName = "failure";
                        break;
                    case ResultWas::DidntThrowException:
                        elementName = "failure";
                        break;

                    // We should never see these here:
                    case ResultWas::Info:
                    case ResultWas::Warning:
                    case ResultWas::Ok:
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        elementName = "internalError";
                        break;
                }

                XmlWriter::ScopedElement e = xml.scopedElement( elementName );

                xml.writeAttribute( "message", result.getExpandedExpression() );
                xml.writeAttribute( "type", result.getTestMacroName() );

                std::ostringstream oss;
                if( !result.getMessage().empty() )
                    oss << result.getMessage() << "\n";
                for( std::vector<MessageInfo>::const_iterator
                        it = stats.infoMessages.begin(),
                        itEnd = stats.infoMessages.end();
                            it != itEnd;
                            ++it )
                    if( it->type == ResultWas::Info )
                        oss << it->message << "\n";

                oss << "at " << result.getSourceInfo();
                xml.writeText( oss.str(), false );
            }
        }